

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

Type dg::vr::Relations::inverted(Type type)

{
  if (type < (UGE|ULE)) {
    return *(Type *)(&DAT_00102090 + (ulong)type * 4);
  }
  abort();
}

Assistant:

Relations::Type Relations::inverted(Relations::Type type) {
    switch (type) {
    case EQ:
        return EQ;
    case NE:
        return NE;
    case SLE:
        return SGE;
    case SLT:
        return SGT;
    case ULE:
        return UGE;
    case ULT:
        return UGT;
    case SGE:
        return SLE;
    case SGT:
        return SLT;
    case UGE:
        return ULE;
    case UGT:
        return ULT;
    case PT:
        return PF;
    case PF:
        return PT;
    }
    assert(0 && "unreachable");
    abort();
}